

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ark_conserved_exp_entropy_erk.c
# Opt level: O0

int ans(sunrealtype t,N_Vector y)

{
  double *pdVar1;
  undefined8 in_RDI;
  double in_XMM0_Qa;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  sunrealtype *ydata;
  sunrealtype b;
  sunrealtype a;
  
  pdVar1 = (double *)N_VGetArrayPointer(in_RDI);
  dVar2 = sqrt(2.718281828459045);
  dVar2 = dVar2 + 2.718281828459045;
  dVar3 = sqrt(2.718281828459045);
  dVar4 = exp(dVar2 * in_XMM0_Qa);
  dVar5 = exp(1.5);
  dVar5 = log(dVar5 + 2.718281828459045);
  dVar6 = log(dVar3 + dVar4);
  *pdVar1 = dVar5 - dVar6;
  dVar5 = exp(dVar2 * in_XMM0_Qa);
  dVar2 = log(dVar2 * dVar5);
  dVar3 = log(dVar3 + dVar4);
  pdVar1[1] = dVar2 - dVar3;
  return 0;
}

Assistant:

int ans(sunrealtype t, N_Vector y)
{
  sunrealtype a, b;
  sunrealtype* ydata = N_VGetArrayPointer(y);

  a = SQRT(EVAL) + EVAL;
  b = SQRT(EVAL) + EXP(a * t);

  ydata[0] = LOG(EVAL + EXP(SUN_RCONST(1.5))) - LOG(b);
  ydata[1] = LOG(a * EXP(a * t)) - LOG(b);

  return 0;
}